

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O1

shared_ptr<BreakPoint> __thiscall Debugger::FindBreakPoint(Debugger *this,lua_Debug *ar)

{
  _Rb_tree_header *p_Var1;
  lua_State *plVar2;
  int iVar3;
  _Base_ptr p_Var4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Rb_tree_header *p_Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<BreakPoint> sVar6;
  string chunkname;
  set<int,_std::less<int>,_std::allocator<int>_> lineSet;
  string local_78;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_58;
  
  plVar2 = (lua_State *)(ar->u).ar51.namewhat;
  if (plVar2 == (lua_State *)0x0) {
    (this->super_enable_shared_from_this<Debugger>)._M_weak_this.
    super___weak_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    (this->super_enable_shared_from_this<Debugger>)._M_weak_this.
    super___weak_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    goto LAB_00144bdf;
  }
  iVar3 = getDebugCurrentLine((lua_Debug *)in_RDX._M_pi);
  EmmyDebuggerManager::GetLineSet
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&local_58,
             (EmmyDebuggerManager *)(ar->u).ar51.source);
  if (iVar3 < 0) {
LAB_00144bc7:
    (this->super_enable_shared_from_this<Debugger>)._M_weak_this.
    super___weak_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    (this->super_enable_shared_from_this<Debugger>)._M_weak_this.
    super___weak_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    p_Var1 = &local_58._M_impl.super__Rb_tree_header;
    p_Var4 = &p_Var1->_M_header;
    for (; (_Rb_tree_header *)local_58._M_impl.super__Rb_tree_header._M_header._M_parent !=
           (_Rb_tree_header *)0x0;
        local_58._M_impl.super__Rb_tree_header._M_header._M_parent =
             (&(local_58._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_left)
             [(int)*(size_t *)(local_58._M_impl.super__Rb_tree_header._M_header._M_parent + 1) <
              iVar3]) {
      if (iVar3 <= (int)*(size_t *)(local_58._M_impl.super__Rb_tree_header._M_header._M_parent + 1))
      {
        p_Var4 = local_58._M_impl.super__Rb_tree_header._M_header._M_parent;
      }
    }
    p_Var5 = p_Var1;
    if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
       (p_Var5 = (_Rb_tree_header *)p_Var4, iVar3 < (int)((_Rb_tree_header *)p_Var4)->_M_node_count)
       ) {
      p_Var5 = p_Var1;
    }
    if (p_Var5 == p_Var1) goto LAB_00144bc7;
    (*lua_getinfo)(plVar2,"S",(lua_Debug *)in_RDX._M_pi);
    GetFile_abi_cxx11_(&local_78,(Debugger *)ar,(lua_Debug *)in_RDX._M_pi);
    FindBreakPoint(this,(string *)ar,(int)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_58);
  in_RDX._M_pi = extraout_RDX;
LAB_00144bdf:
  sVar6.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi;
  sVar6.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<BreakPoint>)sVar6.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BreakPoint> Debugger::FindBreakPoint(lua_Debug *ar) {
	if (!currentL) {
		return nullptr;
	}

	auto L = currentL;

	const int cl = getDebugCurrentLine(ar);
	auto lineSet = manager->GetLineSet();

	if (cl >= 0 && lineSet.find(cl) != lineSet.end()) {
		lua_getinfo(L, "S", ar);
		const auto chunkname = GetFile(ar);
		return FindBreakPoint(chunkname, cl);
	}
	return nullptr;
}